

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap.h
# Opt level: O0

void __thiscall MeCab::Mmap<char>::~Mmap(Mmap<char> *this)

{
  int in_ESI;
  Mmap<char> *in_RDI;
  
  in_RDI->_vptr_Mmap = (_func_int **)&PTR__Mmap_00248548;
  close(in_RDI,in_ESI);
  whatlog::~whatlog((whatlog *)in_RDI);
  std::__cxx11::string::~string((string *)&in_RDI->fileName);
  return;
}

Assistant:

virtual ~Mmap() { this->close(); }